

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

int CECoordinates::CIRS2Observed
              (double ra,double dec,double *az,double *zen,CEDate *date,CEObserver *observer,
              CEAngleType *angle_type,double wavelength,double *observed_ra,double *observed_dec,
              double *hour_angle)

{
  int iVar1;
  CEObserver *in_RCX;
  long *in_RDX;
  double *in_RSI;
  double *in_RDI;
  int *in_R8;
  double *in_R9;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double *in_stack_00000008;
  double *in_stack_00000010;
  double *in_stack_00000070;
  double *in_stack_00000078;
  double *in_stack_00000080;
  double in_stack_00000088;
  double in_stack_00000090;
  int err_code;
  double temp_hour_angle;
  double temp_dec;
  double temp_ra;
  double in_stack_000000f8;
  double local_60;
  double local_58;
  double local_50;
  double *local_48;
  int *local_38;
  CEObserver *local_30;
  double *local_20;
  double *local_18;
  double local_10;
  double local_8;
  
  local_10 = in_XMM1_Qa;
  local_8 = in_XMM0_Qa;
  if (*in_R8 == 0) {
    local_8 = in_XMM0_Qa * 0.017453292519943295;
    local_10 = in_XMM1_Qa * 0.017453292519943295;
  }
  local_48 = in_R9;
  if (in_R9 == (double *)0x0) {
    local_48 = &local_50;
  }
  if (in_stack_00000008 == (double *)0x0) {
    in_stack_00000008 = &local_58;
  }
  if (in_stack_00000010 == (double *)0x0) {
    in_stack_00000010 = &local_60;
  }
  local_38 = in_R8;
  local_30 = in_RCX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  (**(code **)(*in_RDX + 0x20))();
  CEObserver::Longitude_Rad(local_30);
  CEObserver::Latitude_Rad(local_30);
  CEObserver::Elevation_m(local_30);
  CEObserver::Pressure_hPa(local_30);
  CEObserver::Temperature_C(local_30);
  CEObserver::RelativeHumidity(local_30);
  CEDate::dut1((CEDate *)0x12d4c2);
  CEDate::xpolar((CEDate *)0x12d4d5);
  CEDate::ypolar((CEDate *)0x12d4eb);
  iVar1 = CIRS2Observed((double)date,(double)observer,(double *)angle_type,(double *)wavelength,
                        (double)observed_ra,temp_ra,temp_dec,temp_hour_angle,in_stack_00000090,
                        in_stack_00000088,(double)az,dec,ra,in_stack_000000f8,(double)observed_dec,
                        in_stack_00000080,in_stack_00000078,in_stack_00000070);
  if (*local_38 == 0) {
    *local_18 = *local_18 * 57.29577951308232;
    *local_20 = *local_20 * 57.29577951308232;
    *local_48 = *local_48 * 57.29577951308232;
    *in_stack_00000008 = *in_stack_00000008 * 57.29577951308232;
    *in_stack_00000010 = *in_stack_00000010 * 57.29577951308232;
  }
  return iVar1;
}

Assistant:

int CECoordinates::CIRS2Observed(double ra, double dec,
                                 double *az, double *zen,
                                 const CEDate&     date,
                                 const CEObserver& observer,
                                 const CEAngleType& angle_type,
                                 double wavelength,
                                 double *observed_ra,
                                 double *observed_dec,
                                 double *hour_angle)
{
    // If we've passed in angles that are in degrees we need to convert to radians
    if (angle_type == CEAngleType::DEGREES) {
        ra  *= DD2R ;
        dec *= DD2R ;
    }
    
    // Setup the observed RA, Dec and hour_angle variables
    double temp_ra, temp_dec, temp_hour_angle ;
    // If values were passed, point these variables at the passed ones
    if (observed_ra  == nullptr) observed_ra  = &temp_ra;
    if (observed_dec == nullptr) observed_dec = &temp_dec;
    if (hour_angle   == nullptr) hour_angle   = &temp_hour_angle;
    
    int err_code = CIRS2Observed(ra, dec,
                                 az, zen,
                                 date.JD(),
                                 observer.Longitude_Rad(),
                                 observer.Latitude_Rad(),
                                 observer.Elevation_m(),
                                 observer.Pressure_hPa(),
                                 observer.Temperature_C(),
                                 observer.RelativeHumidity(),
                                 date.dut1(),
                                 date.xpolar(),
                                 date.ypolar(),
                                 wavelength,
                                 observed_ra, 
                                 observed_dec, 
                                 hour_angle) ;
    
    // Now convert back to degrees if that's what we were passed
    if (angle_type == CEAngleType::DEGREES) {
        *az              *= DR2D;
        *zen             *= DR2D;
        *observed_ra     *= DR2D;
        *observed_dec    *= DR2D;
        *hour_angle      *= DR2D;
    }
    
    return err_code ;
}